

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

void __thiscall ncnn::ObjectsManager::~ObjectsManager(ObjectsManager *this)

{
  reference ppSVar1;
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  *in_RDI;
  size_t i;
  SafeOrderList<ncnn::ObjectBox> *this_00;
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  *this_01;
  
  for (this_01 = (vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                  *)0x0;
      this_01 < (vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                 *)in_RDI[1].
                   super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      this_01 = (vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                 *)((long)&(this_01->
                           super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
    ppSVar1 = std::
              vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ::operator[](in_RDI,(size_type)this_01);
    this_00 = *ppSVar1;
    if (this_00 != (SafeOrderList<ncnn::ObjectBox> *)0x0) {
      SafeOrderList<ncnn::ObjectBox>::~SafeOrderList(this_00);
      operator_delete(this_00,0x48);
    }
    ppSVar1 = std::
              vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ::operator[](in_RDI,(size_type)this_01);
    *ppSVar1 = (value_type)0x0;
  }
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::clear((vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
           *)0x1b9352);
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::~vector(this_01);
  return;
}

Assistant:

ObjectsManager::~ObjectsManager()
{
    for (size_t i = 0; i < prob_steps; i++)
    {
        delete object_boxs_table[i];
        object_boxs_table[i] = NULL;
    }
    object_boxs_table.clear();
}